

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void libdecorFrameHandleConfigure
               (libdecor_frame *frame,libdecor_configuration *config,void *userData)

{
  _Bool _Var1;
  GLFWbool GVar2;
  libdecor_state *plVar3;
  bool bVar4;
  float fVar5;
  GLFWbool damaged;
  libdecor_state *frameState;
  float targetRatio;
  float aspectRatio;
  GLFWbool maximized;
  GLFWbool activated;
  GLFWbool fullscreen;
  libdecor_window_state windowState;
  int height;
  int width;
  _GLFWwindow *window;
  void *userData_local;
  libdecor_configuration *config_local;
  libdecor_frame *frame_local;
  
  _height = (_GLFWwindow *)userData;
  window = (_GLFWwindow *)userData;
  userData_local = config;
  config_local = (libdecor_configuration *)frame;
  _Var1 = (*_glfw.wl.libdecor.libdecor_configuration_get_window_state_)
                    (config,(libdecor_window_state *)&activated);
  if (_Var1) {
    maximized = (GLFWbool)((activated & 4U) != 0);
    aspectRatio = (float)(uint)((activated & 1U) != 0);
    targetRatio = (float)(uint)((activated & 2U) != 0);
  }
  else {
    maximized = (_height->wl).fullscreen;
    aspectRatio = (float)(_height->wl).activated;
    targetRatio = (float)(_height->wl).maximized;
  }
  _Var1 = (*_glfw.wl.libdecor.libdecor_configuration_get_content_size_)
                    ((libdecor_configuration *)userData_local,(libdecor_frame *)config_local,
                     (int *)&windowState,&fullscreen);
  if (!_Var1) {
    windowState = (_height->wl).width;
    fullscreen = (_height->wl).height;
  }
  if ((((targetRatio == 0.0) && (maximized == 0)) && (_height->numer != -1)) &&
     (_height->denom != -1)) {
    fVar5 = (float)_height->numer / (float)_height->denom;
    if (fVar5 <= (float)(int)windowState / (float)fullscreen) {
      if (fVar5 < (float)(int)windowState / (float)fullscreen) {
        windowState = (libdecor_window_state)((float)fullscreen * fVar5);
      }
    }
    else {
      fullscreen = (GLFWbool)((float)(int)windowState / fVar5);
    }
  }
  plVar3 = (*_glfw.wl.libdecor.libdecor_state_new_)(windowState,fullscreen);
  (*_glfw.wl.libdecor.libdecor_frame_commit_)
            ((libdecor_frame *)config_local,plVar3,(libdecor_configuration *)userData_local);
  (*_glfw.wl.libdecor.libdecor_state_free_)(plVar3);
  if ((((float)(_height->wl).activated != aspectRatio) &&
      ((_height->wl).activated = (GLFWbool)aspectRatio, (_height->wl).activated == 0)) &&
     ((_height->monitor != (_GLFWmonitor *)0x0 && (_height->autoIconify != 0)))) {
    (*_glfw.wl.libdecor.libdecor_frame_set_minimized_)((_height->wl).libdecor.frame);
  }
  if ((float)(_height->wl).maximized != targetRatio) {
    (_height->wl).maximized = (GLFWbool)targetRatio;
    _glfwInputWindowMaximize(_height,(_height->wl).maximized);
  }
  (_height->wl).fullscreen = maximized;
  bVar4 = (_height->wl).visible == 0;
  if (bVar4) {
    (_height->wl).visible = 1;
  }
  GVar2 = resizeWindow(_height,windowState,fullscreen);
  if (GVar2 != 0) {
    _glfwInputWindowSize(_height,(_height->wl).width,(_height->wl).height);
  }
  if (GVar2 != 0 || bVar4) {
    _glfwInputWindowDamage(_height);
  }
  else {
    wl_surface_commit((_height->wl).surface);
  }
  return;
}

Assistant:

void libdecorFrameHandleConfigure(struct libdecor_frame* frame,
                                  struct libdecor_configuration* config,
                                  void* userData)
{
    _GLFWwindow* window = userData;
    int width, height;

    enum libdecor_window_state windowState;
    GLFWbool fullscreen, activated, maximized;

    if (libdecor_configuration_get_window_state(config, &windowState))
    {
        fullscreen = (windowState & LIBDECOR_WINDOW_STATE_FULLSCREEN) != 0;
        activated = (windowState & LIBDECOR_WINDOW_STATE_ACTIVE) != 0;
        maximized = (windowState & LIBDECOR_WINDOW_STATE_MAXIMIZED) != 0;
    }
    else
    {
        fullscreen = window->wl.fullscreen;
        activated = window->wl.activated;
        maximized = window->wl.maximized;
    }

    if (!libdecor_configuration_get_content_size(config, frame, &width, &height))
    {
        width = window->wl.width;
        height = window->wl.height;
    }

    if (!maximized && !fullscreen)
    {
        if (window->numer != GLFW_DONT_CARE && window->denom != GLFW_DONT_CARE)
        {
            const float aspectRatio = (float) width / (float) height;
            const float targetRatio = (float) window->numer / (float) window->denom;
            if (aspectRatio < targetRatio)
                height = width / targetRatio;
            else if (aspectRatio > targetRatio)
                width = height * targetRatio;
        }
    }

    struct libdecor_state* frameState = libdecor_state_new(width, height);
    libdecor_frame_commit(frame, frameState, config);
    libdecor_state_free(frameState);

    if (window->wl.activated != activated)
    {
        window->wl.activated = activated;
        if (!window->wl.activated)
        {
            if (window->monitor && window->autoIconify)
                libdecor_frame_set_minimized(window->wl.libdecor.frame);
        }
    }

    if (window->wl.maximized != maximized)
    {
        window->wl.maximized = maximized;
        _glfwInputWindowMaximize(window, window->wl.maximized);
    }

    window->wl.fullscreen = fullscreen;

    GLFWbool damaged = GLFW_FALSE;

    if (!window->wl.visible)
    {
        window->wl.visible = GLFW_TRUE;
        damaged = GLFW_TRUE;
    }

    if (resizeWindow(window, width, height))
    {
        _glfwInputWindowSize(window, window->wl.width, window->wl.height);
        damaged = GLFW_TRUE;
    }

    if (damaged)
        _glfwInputWindowDamage(window);
    else
        wl_surface_commit(window->wl.surface);
}